

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array.cpp
# Opt level: O0

ON_UuidIndexList2 * __thiscall
ON_UuidIndexList2::operator=(ON_UuidIndexList2 *this,ON_UuidIndexList2 *src)

{
  ON_UuidIndexList2_Private *this_00;
  type pOVar1;
  ON_UuidIndexList2 *src_local;
  ON_UuidIndexList2 *this_local;
  
  if (this != src) {
    this_00 = (ON_UuidIndexList2_Private *)operator_new(0x38);
    pOVar1 = std::
             unique_ptr<ON_UuidIndexList2_Private,_std::default_delete<ON_UuidIndexList2_Private>_>
             ::operator*(&src->m_private);
    ON_UuidIndexList2_Private::ON_UuidIndexList2_Private(this_00,pOVar1);
    std::unique_ptr<ON_UuidIndexList2_Private,_std::default_delete<ON_UuidIndexList2_Private>_>::
    reset(&this->m_private,this_00);
  }
  return this;
}

Assistant:

ON_UuidIndexList2& ON_UuidIndexList2::operator=(const ON_UuidIndexList2& src)
{
  if (this != &src)
  {
    m_private.reset(new ON_UuidIndexList2_Private(*src.m_private));
  }
  return *this;
}